

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArtificialPopulation.cpp
# Opt level: O0

void __thiscall ArtificialPopulation::ArtificialPopulation(ArtificialPopulation *this,ANN *a)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ANN *in_RSI;
  int *in_RDI;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int *x;
  undefined4 uVar5;
  Population *in_stack_ffffffffffffffe0;
  
  Population::Population
            ((Population *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  *(undefined ***)in_RDI = &PTR_update_0018ec70;
  x = in_RDI + 0x1a;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x16d88a);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x16d89f);
  iVar1 = ANN::getInputSize(in_RSI);
  in_RDI[8] = iVar1;
  iVar2 = ANN::getInputSize(in_RSI);
  in_RDI[9] = iVar2;
  iVar3 = ANN::getOutputSize(in_RSI);
  in_RDI[10] = iVar3;
  Population::initialize(in_stack_ffffffffffffffe0);
  *(ANN **)(in_RDI + 0x18) = in_RSI;
  uVar5 = 1;
  iVar4 = ANN::getInputSize(*(ANN **)(in_RDI + 0x18));
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,__1,__1,_0,__1,__1> *)CONCAT44(uVar5,iVar4),x,in_RDI);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=
            ((Matrix<double,__1,__1,_0,__1,__1> *)CONCAT44(iVar1,iVar2),
             (Matrix<double,__1,__1,_0,__1,__1> *)CONCAT44(iVar3,iVar4));
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x16d95a);
  return;
}

Assistant:

ArtificialPopulation::ArtificialPopulation(ANN* a) {
    numberOfNeurons = a->getInputSize();
    numberOfInputNeurons = a->getInputSize();
    numberOfOutputNeurons = a->getOutputSize();
    initialize();
    ann = a;
    annInput = Eigen::MatrixXd(1, ann->getInputSize());
}